

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling.cpp
# Opt level: O0

void __thiscall
ncnn::Pooling::make_padding(Pooling *this,Mat *bottom_blob,Mat *bottom_blob_bordered,Option *opt)

{
  void *in_RCX;
  long in_RSI;
  long in_RDI;
  Option opt_b_3;
  int hpad_1;
  int wpad_1;
  Option opt_b_2;
  int hpad;
  int wpad;
  Option opt_b_1;
  Option opt_b;
  int htail;
  int wtail;
  int htailpad;
  int wtailpad;
  float pad_value;
  int h;
  int w;
  float in_stack_000007f4;
  int in_stack_000007f8;
  int in_stack_000007fc;
  int in_stack_00000800;
  int in_stack_00000804;
  Mat *in_stack_00000808;
  Mat *in_stack_00000810;
  int in_stack_00000820;
  Option *in_stack_00000828;
  Mat *in_stack_fffffffffffffed0;
  Mat *in_stack_fffffffffffffed8;
  undefined4 local_fc;
  undefined1 local_f0 [8];
  undefined8 local_e8;
  int local_c8;
  int local_c4;
  undefined1 local_c0 [8];
  undefined8 local_b8;
  int local_98;
  int local_94;
  undefined1 local_90 [8];
  undefined8 local_88;
  undefined1 local_68 [8];
  undefined8 local_60;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  undefined4 local_2c;
  int local_28;
  int local_24;
  void *local_20;
  long local_10;
  
  local_24 = *(int *)(in_RSI + 0x2c);
  local_28 = *(int *)(in_RSI + 0x30);
  local_20 = in_RCX;
  local_10 = in_RSI;
  Mat::operator=(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  if (*(int *)(in_RDI + 0xb8) == 0) {
    local_fc = 0xc3000000;
    if (*(long *)(local_10 + 0x10) != 1) {
      local_fc = 0xff7fffff;
    }
    local_2c = local_fc;
  }
  else {
    local_2c = 0;
  }
  local_30 = 0;
  local_34 = 0;
  if (*(int *)(in_RDI + 0xe0) == 0) {
    local_38 = ((local_24 + *(int *)(in_RDI + 0xcc) + *(int *)(in_RDI + 0xd0)) -
               *(int *)(in_RDI + 0xbc)) % *(int *)(in_RDI + 0xc4);
    local_3c = ((local_28 + *(int *)(in_RDI + 0xd4) + *(int *)(in_RDI + 0xd8)) -
               *(int *)(in_RDI + 0xc0)) % *(int *)(in_RDI + 200);
    if (local_38 != 0) {
      local_30 = *(int *)(in_RDI + 0xc4) - local_38;
    }
    if (local_3c != 0) {
      local_34 = *(int *)(in_RDI + 200) - local_3c;
    }
    memcpy(local_68,local_20,0x28);
    local_60 = *(undefined8 *)((long)local_20 + 0x10);
    copy_make_border(in_stack_00000810,in_stack_00000808,in_stack_00000804,in_stack_00000800,
                     in_stack_000007fc,in_stack_000007f8,in_stack_00000820,in_stack_000007f4,
                     in_stack_00000828);
  }
  else if (*(int *)(in_RDI + 0xe0) == 1) {
    memcpy(local_90,local_20,0x28);
    local_88 = *(undefined8 *)((long)local_20 + 0x10);
    copy_make_border(in_stack_00000810,in_stack_00000808,in_stack_00000804,in_stack_00000800,
                     in_stack_000007fc,in_stack_000007f8,in_stack_00000820,in_stack_000007f4,
                     in_stack_00000828);
  }
  else if (*(int *)(in_RDI + 0xe0) == 2) {
    local_94 = (*(int *)(in_RDI + 0xbc) +
               ((local_24 + -1) / *(int *)(in_RDI + 0xc4)) * *(int *)(in_RDI + 0xc4)) - local_24;
    local_98 = (*(int *)(in_RDI + 0xc0) +
               ((local_28 + -1) / *(int *)(in_RDI + 200)) * *(int *)(in_RDI + 200)) - local_28;
    if ((0 < local_94) || (0 < local_98)) {
      memcpy(local_c0,local_20,0x28);
      local_b8 = *(undefined8 *)((long)local_20 + 0x10);
      copy_make_border(in_stack_00000810,in_stack_00000808,in_stack_00000804,in_stack_00000800,
                       in_stack_000007fc,in_stack_000007f8,in_stack_00000820,in_stack_000007f4,
                       in_stack_00000828);
    }
  }
  else if (*(int *)(in_RDI + 0xe0) == 3) {
    local_c4 = (*(int *)(in_RDI + 0xbc) +
               ((local_24 + -1) / *(int *)(in_RDI + 0xc4)) * *(int *)(in_RDI + 0xc4)) - local_24;
    local_c8 = (*(int *)(in_RDI + 0xc0) +
               ((local_28 + -1) / *(int *)(in_RDI + 200)) * *(int *)(in_RDI + 200)) - local_28;
    if ((0 < local_c4) || (0 < local_c8)) {
      memcpy(local_f0,local_20,0x28);
      local_e8 = *(undefined8 *)((long)local_20 + 0x10);
      copy_make_border(in_stack_00000810,in_stack_00000808,in_stack_00000804,in_stack_00000800,
                       in_stack_000007fc,in_stack_000007f8,in_stack_00000820,in_stack_000007f4,
                       in_stack_00000828);
    }
  }
  return;
}

Assistant:

void Pooling::make_padding(const Mat& bottom_blob, Mat& bottom_blob_bordered, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;

    bottom_blob_bordered = bottom_blob;

    float pad_value = 0.f;
    if (pooling_type == PoolMethod_MAX)
    {
        pad_value = bottom_blob.elemsize == 1 ? -128.f : -FLT_MAX;
    }
    else if (pooling_type == PoolMethod_AVE)
    {
        pad_value = 0.f;
    }

    int wtailpad = 0;
    int htailpad = 0;

    if (pad_mode == 0) // full padding
    {
        int wtail = (w + pad_left + pad_right - kernel_w) % stride_w;
        int htail = (h + pad_top + pad_bottom - kernel_h) % stride_h;

        if (wtail != 0)
            wtailpad = stride_w - wtail;
        if (htail != 0)
            htailpad = stride_h - htail;

        Option opt_b = opt;
        opt_b.blob_allocator = opt.workspace_allocator;
        copy_make_border(bottom_blob, bottom_blob_bordered, pad_top, pad_bottom + htailpad, pad_left, pad_right + wtailpad, BORDER_CONSTANT, pad_value, opt_b);
    }
    else if (pad_mode == 1) // valid padding
    {
        Option opt_b = opt;
        opt_b.blob_allocator = opt.workspace_allocator;
        copy_make_border(bottom_blob, bottom_blob_bordered, pad_top, pad_bottom, pad_left, pad_right, BORDER_CONSTANT, pad_value, opt_b);
    }
    else if (pad_mode == 2) // tensorflow padding=SAME or onnx padding=SAME_UPPER
    {
        int wpad = kernel_w + (w - 1) / stride_w * stride_w - w;
        int hpad = kernel_h + (h - 1) / stride_h * stride_h - h;
        if (wpad > 0 || hpad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(bottom_blob, bottom_blob_bordered, hpad / 2, hpad - hpad / 2, wpad / 2, wpad - wpad / 2, BORDER_CONSTANT, pad_value, opt_b);
        }
    }
    else if (pad_mode == 3) // onnx padding=SAME_LOWER
    {
        int wpad = kernel_w + (w - 1) / stride_w * stride_w - w;
        int hpad = kernel_h + (h - 1) / stride_h * stride_h - h;
        if (wpad > 0 || hpad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(bottom_blob, bottom_blob_bordered, hpad - hpad / 2, hpad / 2, wpad - wpad / 2, wpad / 2, BORDER_CONSTANT, pad_value, opt_b);
        }
    }
}